

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

void js_promise_resolve_function_finalizer(JSRuntime *rt,JSValue val)

{
  int iVar1;
  JSValueUnion *pJVar2;
  int *piVar3;
  JSValueUnion JVar4;
  JSValueUnion JVar5;
  JSValue v;
  
  pJVar2 = *(JSValueUnion **)((long)val.u.ptr + 0x30);
  if (pJVar2 != (JSValueUnion *)0x0) {
    piVar3 = (int *)pJVar2[2].ptr;
    *piVar3 = *piVar3 + -1;
    if (*piVar3 == 0) {
      (*(rt->mf).js_free)(&rt->malloc_state,piVar3);
    }
    JVar4 = pJVar2[1];
    if (0xfffffff4 < (uint)JVar4.int32) {
      JVar5 = (JSValueUnion)pJVar2->ptr;
      iVar1 = *JVar5.ptr;
      *(int *)JVar5.ptr = iVar1 + -1;
      if (iVar1 < 2) {
        v.tag = (int64_t)JVar4.ptr;
        v.u.ptr = JVar5.ptr;
        __JS_FreeValueRT(rt,v);
      }
    }
    (*(rt->mf).js_free)(&rt->malloc_state,pJVar2);
    return;
  }
  return;
}

Assistant:

static void js_promise_resolve_function_finalizer(JSRuntime *rt, JSValue val)
{
    JSPromiseFunctionData *s = JS_VALUE_GET_OBJ(val)->u.promise_function_data;
    if (s) {
        js_promise_resolve_function_free_resolved(rt, s->presolved);
        JS_FreeValueRT(rt, s->promise);
        js_free_rt(rt, s);
    }
}